

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::generateNewIdentifier(BrokerBase *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  genId_abi_cxx11_();
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->identifier,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  this->uuid_like = false;
  return;
}

Assistant:

void BrokerBase::generateNewIdentifier()
{
    identifier = genId();
    uuid_like = false;
}